

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

int __thiscall
doctest::detail::MultiLaneAtomic<int>::fetch_add
          (MultiLaneAtomic<int> *this,int arg,memory_order order)

{
  atomic<int> *paVar1;
  memory_order order_local;
  int arg_local;
  MultiLaneAtomic<int> *this_local;
  
  paVar1 = myAtomic(this);
  switch(order) {
  case memory_order_consume:
  case memory_order_acquire:
    LOCK();
    this_local._0_4_ = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + arg;
    UNLOCK();
    break;
  case memory_order_release:
    LOCK();
    this_local._0_4_ = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + arg;
    UNLOCK();
    break;
  case memory_order_acq_rel:
    LOCK();
    this_local._0_4_ = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + arg;
    UNLOCK();
    break;
  case memory_order_seq_cst:
    LOCK();
    this_local._0_4_ = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + arg;
    UNLOCK();
    break;
  default:
    LOCK();
    this_local._0_4_ = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + arg;
    UNLOCK();
  }
  return (int)this_local;
}

Assistant:

T fetch_add(T arg, std::memory_order order = std::memory_order_seq_cst) DOCTEST_NOEXCEPT {
            return myAtomic().fetch_add(arg, order);
        }